

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O2

ssize_t __thiscall MeshLib::Solid::read(Solid *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  FILE *__stream;
  char *pcVar5;
  tVertex pVVar6;
  tFace pFVar7;
  tHalfEdge pHVar8;
  double *pdVar9;
  tEdge pEVar10;
  ssize_t extraout_RAX;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  Solid *this_00;
  int i;
  long lVar11;
  string *this_01;
  string s;
  Point p;
  char line [2048];
  string local_898 [32];
  Point local_878;
  double local_860;
  allocator local_858 [32];
  char local_838 [2056];
  
  __stream = fopen((char *)CONCAT44(in_register_00000034,__fd),"r");
  if (__stream == (FILE *)0x0) {
    iVar1 = fprintf(_stderr,"Error is opening file %s\n",(char *)CONCAT44(in_register_00000034,__fd)
                   );
    return CONCAT44(extraout_var,iVar1);
  }
LAB_00110a48:
  while( true ) {
    iVar1 = feof(__stream);
    if (iVar1 != 0) break;
    fgets(local_838,0x800,__stream);
    iVar1 = feof(__stream);
    if ((iVar1 != 0) || (local_838[0] == '\0')) break;
    pcVar5 = strtok(local_838," \r\n\t");
    iVar1 = strcmp(pcVar5,"Vertex");
    if (iVar1 == 0) goto LAB_00110bba;
    iVar1 = strcmp(pcVar5,"Face");
    if (iVar1 == 0) {
      pcVar5 = strtok((char *)0x0," \r\n\t");
      iVar1 = atoi(pcVar5);
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        pcVar5 = strtok((char *)0x0," \r\n\t");
        iVar2 = atoi(pcVar5);
        *(int *)((long)local_878.v + lVar11 * 4) = iVar2;
      }
      pFVar7 = createFace(this,(int *)&local_878,iVar1);
      pcVar5 = strtok((char *)0x0,"\r\n\t");
      if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
        std::__cxx11::string::string(local_898,pcVar5,local_858);
        uVar3 = std::__cxx11::string::find((char *)local_898,0x1156b0);
        uVar4 = std::__cxx11::string::find((char *)local_898,0x115706);
        if (-1 < (int)(uVar4 | uVar3)) {
          std::__cxx11::string::substr((ulong)local_858,(ulong)local_898);
          this_01 = (string *)&pFVar7->m_string;
          goto LAB_00110e2f;
        }
        goto LAB_00110e47;
      }
    }
    else {
      iVar1 = strcmp(pcVar5,"Edge");
      if (iVar1 == 0) {
        pcVar5 = strtok((char *)0x0," \r\n\t");
        iVar1 = atoi(pcVar5);
        pcVar5 = strtok((char *)0x0," \r\n\t");
        iVar2 = atoi(pcVar5);
        pEVar10 = idEdge(this,iVar1,iVar2);
        pcVar5 = strtok((char *)0x0,"\r\n\t");
        std::__cxx11::string::string(local_898,pcVar5,local_858);
        uVar3 = std::__cxx11::string::find((char *)local_898,0x1156b0);
        uVar4 = std::__cxx11::string::find((char *)local_898,0x115706);
        if (-1 < (int)(uVar4 | uVar3)) {
          std::__cxx11::string::substr((ulong)local_858,(ulong)local_898);
          this_01 = (string *)&pEVar10->m_string;
          goto LAB_00110e2f;
        }
        goto LAB_00110e47;
      }
      iVar1 = strcmp(pcVar5,"Corner");
      if (iVar1 == 0) {
        pcVar5 = strtok((char *)0x0," \r\n\t");
        iVar1 = atoi(pcVar5);
        pcVar5 = strtok((char *)0x0," \r\n\t");
        iVar2 = atoi(pcVar5);
        pVVar6 = idVertex(this,iVar1);
        this_00 = this;
        pFVar7 = idFace(this,iVar2);
        pHVar8 = corner(this_00,pVVar6,pFVar7);
        pcVar5 = strtok((char *)0x0,"\r\n\t");
        std::__cxx11::string::string(local_898,pcVar5,local_858);
        uVar3 = std::__cxx11::string::find((char *)local_898,0x1156b0);
        uVar4 = std::__cxx11::string::find((char *)local_898,0x115706);
        if ((int)(uVar4 | uVar3) < 0) goto LAB_00110e47;
        std::__cxx11::string::substr((ulong)local_858,(ulong)local_898);
        this_01 = (string *)&pHVar8->m_string;
        goto LAB_00110e2f;
      }
    }
  }
  labelBoundaryEdges(this);
  removeDanglingVertices(this);
  return extraout_RAX;
LAB_00110bba:
  pcVar5 = strtok((char *)0x0," \r\n\t");
  iVar1 = atoi(pcVar5);
  local_878.v[0] = 0.0;
  local_878.v[1] = 0.0;
  local_878.v[2] = 0.0;
  for (iVar2 = 0; iVar2 != 3; iVar2 = iVar2 + 1) {
    pcVar5 = strtok((char *)0x0," \r\n\t");
    local_860 = atof(pcVar5);
    pdVar9 = Point::operator[](&local_878,iVar2);
    *pdVar9 = local_860;
  }
  pVVar6 = createVertex(this,iVar1);
  (pVVar6->m_point).v[2] = local_878.v[2];
  (pVVar6->m_point).v[0] = local_878.v[0];
  (pVVar6->m_point).v[1] = local_878.v[1];
  pVVar6->m_id = iVar1;
  pcVar5 = strtok((char *)0x0,"\r\n\t");
  if (pcVar5 != (char *)0x0) {
    std::__cxx11::string::string(local_898,pcVar5,local_858);
    uVar3 = std::__cxx11::string::find((char *)local_898,0x1156b0);
    uVar4 = std::__cxx11::string::find((char *)local_898,0x115706);
    if (-1 < (int)(uVar4 | uVar3)) {
      std::__cxx11::string::substr((ulong)local_858,(ulong)local_898);
      this_01 = (string *)&pVVar6->m_string;
LAB_00110e2f:
      std::__cxx11::string::operator=(this_01,(string *)local_858);
      std::__cxx11::string::~string((string *)local_858);
    }
LAB_00110e47:
    std::__cxx11::string::~string(local_898);
  }
  goto LAB_00110a48;
}

Assistant:

void Solid::read( const char * input ) {
	FILE * is = fopen( input, "r" );
	if( is == NULL ) {
		fprintf(stderr,"Error is opening file %s\n", input );
		return;
	}

	char line[MAX_LINE];
	int id;

	while( !feof(is)  ) {		
		fgets( line, MAX_LINE, is );
		if(  feof(is) || strlen( line ) == 0  ) break;

		char * str = strtok( line, " \r\n\t");
		if( strcmp(str, "Vertex" ) == 0 ) 
		{
			
			str = strtok(NULL," \r\n\t");

			id = atoi( str );


			Point p;
			for( int i = 0 ; i < 3; i ++ )
			{
				str = strtok(NULL," \r\n\t");
				p[i] = atof( str );
			}
		
			tVertex v  = createVertex( id );
			
			v->point() = p;
			v->id()    = id;

			str = strtok( NULL, "\r\n\t");

			if( str == NULL ) continue;

			std::string s(str);
			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				v->string() = s.substr( sp+1, ep-sp-1 );
			}

			continue;

		}
		

		if( strcmp(str,"Face") == 0 ) {
			str = strtok(NULL, " \r\n\t");

			id = atoi( str );
			
	
			int v[3];
			for( int i = 0; i < 3; i ++ ) {
				str = strtok(NULL," \r\n\t");
				v[i] = atoi( str );
			}

			tFace f = createFace( v, id );
			
			str = strtok( NULL, "\r\n\t");
			if ( str== NULL || strlen( str ) == 0 ) continue;

			std::string s(str);

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 ) {
				f->string() = s.substr( sp+1, ep-sp-1 );
			}
			continue;
		}

		//read in edge attributes
		if( strcmp(str,"Edge")==0 ) {
			str = strtok(NULL, " \r\n\t");
			int id0 = atoi( str );

			str = strtok(NULL, " \r\n\t");
			int id1 = atoi( str );

			tEdge edge = idEdge( id0, id1 );
			

			str = strtok(NULL, "\r\n\t");

			std::string s(str);
			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 ) {
				edge->string() = s.substr( sp+1, ep-sp-1 );
			}
			
			continue;

		}

		//read in edge attributes
		if( strcmp(str,"Corner")==0 ) {
			str = strtok(NULL," \r\n\t");
			int id0 = atoi( str );
				
			str = strtok(NULL," \r\n\t");
			int id1 = atoi( str );


			Vertex * v = idVertex( id0 );
			Face   * f = idFace( id1 );
			tHalfEdge he = corner( v, f );

			str = strtok(NULL,"\r\n\t");
			std::string s(str);

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				he->string() = s.substr( sp+1, ep-sp-1 );
			}
			continue;
		}


	}

	
	labelBoundaryEdges();
	removeDanglingVertices();


}